

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::LWSImporter::CanRead(LWSImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  string extension;
  uint32_t tokens [2];
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"lws");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&extension,"mot");
    if (!bVar1) {
      if (extension._M_string_length == 0 || checkSig) {
        tokens[0] = 0x4c575343;
        tokens[1] = 0x4c574d4f;
        bVar2 = BaseImporter::CheckMagicToken(pIOHandler,pFile,tokens,2,0,4);
      }
      else {
        bVar2 = false;
      }
    }
  }
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool LWSImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler,bool checkSig) const
{
    const std::string extension = GetExtension(pFile);
    if (extension == "lws" || extension == "mot")
        return true;

    // if check for extension is not enough, check for the magic tokens LWSC and LWMO
    if (!extension.length() || checkSig) {
        uint32_t tokens[2];
        tokens[0] = AI_MAKE_MAGIC("LWSC");
        tokens[1] = AI_MAKE_MAGIC("LWMO");
        return CheckMagicToken(pIOHandler,pFile,tokens,2);
    }
    return false;
}